

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_ldrddi.cpp
# Opt level: O0

ze_result_t zeGetEventExpProcAddrTable(ze_api_version_t version,ze_event_exp_dditable_t *pDdiTable)

{
  bool bVar1;
  size_type sVar2;
  vector<loader::driver_t,_std::allocator<loader::driver_t>_> *this;
  reference pdVar3;
  reference pvVar4;
  code *pcVar5;
  ze_kernel_timestamp_result_t *pzVar6;
  uint32_t *extraout_RDX;
  undefined1 auVar7 [16];
  ze_kernel_timestamp_result_t *local_60;
  ze_event_exp_dditable_t dditable;
  ze_pfnGetEventExpProcAddrTable_t getTable_2;
  ze_pfnGetEventExpProcAddrTable_t getTable_1;
  ze_pfnGetEventExpProcAddrTable_t getTable;
  driver_t *drv;
  iterator __end1;
  iterator __begin1;
  driver_vector_t *__range1;
  ze_result_t result;
  ze_event_exp_dditable_t *pDdiTable_local;
  ze_api_version_t version_local;
  
  sVar2 = std::vector<loader::driver_t,_std::allocator<loader::driver_t>_>::size
                    ((vector<loader::driver_t,_std::allocator<loader::driver_t>_> *)
                     (loader::context + 0x15e0));
  if (sVar2 == 0) {
    pDdiTable_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  else if (pDdiTable == (ze_event_exp_dditable_t *)0x0) {
    pDdiTable_local._4_4_ = ZE_RESULT_ERROR_INVALID_NULL_POINTER;
  }
  else if (*(int *)(loader::context + 0x15c0) < (int)version) {
    pDdiTable_local._4_4_ = ZE_RESULT_ERROR_UNSUPPORTED_VERSION;
  }
  else {
    __range1._4_4_ = ZE_RESULT_SUCCESS;
    this = (vector<loader::driver_t,_std::allocator<loader::driver_t>_> *)(loader::context + 0x15e0)
    ;
    __end1 = std::vector<loader::driver_t,_std::allocator<loader::driver_t>_>::begin(this);
    drv = (driver_t *)std::vector<loader::driver_t,_std::allocator<loader::driver_t>_>::end(this);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<loader::driver_t_*,_std::vector<loader::driver_t,_std::allocator<loader::driver_t>_>_>
                                       *)&drv), bVar1) {
      pdVar3 = __gnu_cxx::
               __normal_iterator<loader::driver_t_*,_std::vector<loader::driver_t,_std::allocator<loader::driver_t>_>_>
               ::operator*(&__end1);
      if ((pdVar3->initStatus == ZE_RESULT_SUCCESS) &&
         (pcVar5 = (code *)dlsym(pdVar3->handle,"zeGetEventExpProcAddrTable"), pcVar5 != (code *)0x0
         )) {
        __range1._4_4_ = (*pcVar5)(version,&(pdVar3->dditable).ze.EventExp);
      }
      __gnu_cxx::
      __normal_iterator<loader::driver_t_*,_std::vector<loader::driver_t,_std::allocator<loader::driver_t>_>_>
      ::operator++(&__end1);
    }
    if (__range1._4_4_ == ZE_RESULT_SUCCESS) {
      sVar2 = std::vector<loader::driver_t,_std::allocator<loader::driver_t>_>::size
                        ((vector<loader::driver_t,_std::allocator<loader::driver_t>_> *)
                         (loader::context + 0x15e0));
      if ((sVar2 < 2) && ((*(byte *)(loader::context + 0x1629) & 1) == 0)) {
        pvVar4 = std::vector<loader::driver_t,_std::allocator<loader::driver_t>_>::front
                           ((vector<loader::driver_t,_std::allocator<loader::driver_t>_> *)
                            (loader::context + 0x15e0));
        pDdiTable->pfnQueryTimestampsExp = (pvVar4->dditable).ze.EventExp.pfnQueryTimestampsExp;
      }
      else {
        pDdiTable->pfnQueryTimestampsExp = loader::zeEventQueryTimestampsExp;
      }
    }
    if ((__range1._4_4_ == ZE_RESULT_SUCCESS) && (*(long *)(loader::context + 0x1618) != 0)) {
      pcVar5 = (code *)dlsym(*(undefined8 *)(loader::context + 0x1618),"zeGetEventExpProcAddrTable")
      ;
      if (pcVar5 == (code *)0x0) {
        return ZE_RESULT_ERROR_UNINITIALIZED;
      }
      __range1._4_4_ = (*pcVar5)(version,pDdiTable);
    }
    if ((__range1._4_4_ == ZE_RESULT_SUCCESS) && (*(long *)(loader::context + 0x1620) != 0)) {
      pzVar6 = (ze_kernel_timestamp_result_t *)loader::context;
      auVar7 = dlsym(*(undefined8 *)(loader::context + 0x1620),"zeGetEventExpProcAddrTable");
      dditable.pfnQueryTimestampsExp = auVar7._0_8_;
      if (dditable.pfnQueryTimestampsExp == (ze_pfnEventQueryTimestampsExp_t)0x0) {
        return ZE_RESULT_ERROR_UNINITIALIZED;
      }
      local_60 = (ze_kernel_timestamp_result_t *)pDdiTable->pfnQueryTimestampsExp;
      __range1._4_4_ =
           (*dditable.pfnQueryTimestampsExp)
                     ((ze_event_handle_t)(ulong)version,(ze_device_handle_t)&local_60,auVar7._8_8_,
                      pzVar6);
      *(ze_kernel_timestamp_result_t **)(loader::context + 0x1b50) = local_60;
      if ((*(byte *)(loader::context + 0x1652) & 1) != 0) {
        __range1._4_4_ =
             (*dditable.pfnQueryTimestampsExp)
                       ((ze_event_handle_t)(ulong)version,(ze_device_handle_t)pDdiTable,extraout_RDX
                        ,local_60);
      }
    }
    pDdiTable_local._4_4_ = __range1._4_4_;
  }
  return pDdiTable_local._4_4_;
}

Assistant:

ZE_DLLEXPORT ze_result_t ZE_APICALL
zeGetEventExpProcAddrTable(
    ze_api_version_t version,                       ///< [in] API version requested
    ze_event_exp_dditable_t* pDdiTable              ///< [in,out] pointer to table of DDI function pointers
    )
{
    if( loader::context->zeDrivers.size() < 1 ) {
        return ZE_RESULT_ERROR_UNINITIALIZED;
    }

    if( nullptr == pDdiTable )
        return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

    if( loader::context->version < version )
        return ZE_RESULT_ERROR_UNSUPPORTED_VERSION;

    ze_result_t result = ZE_RESULT_SUCCESS;

    // Load the device-driver DDI tables
    for( auto& drv : loader::context->zeDrivers )
    {
        if(drv.initStatus != ZE_RESULT_SUCCESS)
            continue;
        auto getTable = reinterpret_cast<ze_pfnGetEventExpProcAddrTable_t>(
            GET_FUNCTION_PTR( drv.handle, "zeGetEventExpProcAddrTable") );
        if(!getTable) 
            continue; 
        result = getTable( version, &drv.dditable.ze.EventExp);
    }


    if( ZE_RESULT_SUCCESS == result )
    {
        if( ( loader::context->zeDrivers.size() > 1 ) || loader::context->forceIntercept )
        {
            // return pointers to loader's DDIs
            pDdiTable->pfnQueryTimestampsExp                       = loader::zeEventQueryTimestampsExp;
        }
        else
        {
            // return pointers directly to driver's DDIs
            *pDdiTable = loader::context->zeDrivers.front().dditable.ze.EventExp;
        }
    }

    // If the validation layer is enabled, then intercept the loader's DDIs
    if(( ZE_RESULT_SUCCESS == result ) && ( nullptr != loader::context->validationLayer ))
    {
        auto getTable = reinterpret_cast<ze_pfnGetEventExpProcAddrTable_t>(
            GET_FUNCTION_PTR(loader::context->validationLayer, "zeGetEventExpProcAddrTable") );
        if(!getTable)
            return ZE_RESULT_ERROR_UNINITIALIZED;
        result = getTable( version, pDdiTable );
    }

    // If the API tracing layer is enabled, then intercept the loader's DDIs
    if(( ZE_RESULT_SUCCESS == result ) && ( nullptr != loader::context->tracingLayer ))
    {
        auto getTable = reinterpret_cast<ze_pfnGetEventExpProcAddrTable_t>(
            GET_FUNCTION_PTR(loader::context->tracingLayer, "zeGetEventExpProcAddrTable") );
        if(!getTable)
            return ZE_RESULT_ERROR_UNINITIALIZED;
        ze_event_exp_dditable_t dditable;
        memcpy(&dditable, pDdiTable, sizeof(ze_event_exp_dditable_t));
        result = getTable( version, &dditable );
        loader::context->tracing_dditable.ze.EventExp = dditable;
        if ( loader::context->tracingLayerEnabled ) {
            result = getTable( version, pDdiTable );
        }
    }

    return result;
}